

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator_test.cc
# Opt level: O2

int main(void)

{
  uint __line;
  bool bVar1;
  Title *this;
  AsteriskDecorator *this_00;
  PlusDecorator *this_01;
  Element *pEVar2;
  char *__assertion;
  string value;
  string local_60;
  string local_40;
  
  this = (Title *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_40,"docorate!",(allocator *)&value);
  Title::Title(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (**(this->super_Element)._vptr_Element)(&value,this);
  bVar1 = std::operator==(&value,"docorate!");
  if (bVar1) {
    (**(this->super_Element)._vptr_Element)(&local_60,this);
    std::__cxx11::string::operator=((string *)&value,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    bVar1 = std::operator==(&value,"docorate!");
    if (bVar1) {
      this_00 = (AsteriskDecorator *)operator_new(0x10);
      (this_00->super_Decorator).element = (Element *)this;
      (this_00->super_Decorator).super_Element._vptr_Element =
           (_func_int **)&PTR_print_abi_cxx11__00103d70;
      AsteriskDecorator::print_abi_cxx11_(&local_60,this_00);
      std::__cxx11::string::operator=((string *)&value,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      bVar1 = std::operator==(&value,"*docorate!*");
      if (bVar1) {
        this_01 = (PlusDecorator *)operator_new(0x10);
        pEVar2 = (Element *)operator_new(0x10);
        pEVar2[1]._vptr_Element = (_func_int **)this;
        pEVar2->_vptr_Element = (_func_int **)&PTR_print_abi_cxx11__00103d70;
        (this_01->super_Decorator).element = pEVar2;
        (this_01->super_Decorator).super_Element._vptr_Element =
             (_func_int **)&PTR_print_abi_cxx11__00103da0;
        PlusDecorator::print_abi_cxx11_(&local_60,this_01);
        std::__cxx11::string::operator=((string *)&value,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        bVar1 = std::operator==(&value,"+*docorate!*+");
        if (bVar1) {
          std::__cxx11::string::~string((string *)&value);
          return 0;
        }
        __assertion = "value == \"+*docorate!*+\"";
        __line = 0x16;
      }
      else {
        __assertion = "value == \"*docorate!*\"";
        __line = 0x12;
      }
    }
    else {
      __assertion = "value == \"docorate!\"";
      __line = 0xe;
    }
  }
  else {
    __assertion = "value == \"docorate!\"";
    __line = 10;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/structural/decorator_test.cc"
                ,__line,"int main()");
}

Assistant:

int main() {
  Title* title = new Title("docorate!");
  std::string value = title->print();
  assert(value == "docorate!");

  Decorator* decorator = new Decorator(title);
  value = decorator->print();
  assert(value == "docorate!");

  decorator = new AsteriskDecorator(title);
  value = decorator->print();
  assert(value == "*docorate!*");

  decorator = new PlusDecorator(new AsteriskDecorator(title));
  value = decorator->print();
  assert(value == "+*docorate!*+");
}